

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall sing::HttpServer::start(HttpServer *this)

{
  TimerManager *pTVar1;
  bool bVar2;
  uint uVar3;
  __pid_t _Var4;
  uint32_t uVar5;
  HttpContext *pHVar6;
  ThreadPool *this_00;
  int index;
  int iVar7;
  _Any_data local_58;
  HttpContext *local_48;
  HttpServer *pHStack_40;
  
  pHVar6 = (HttpContext *)operator_new(0x288);
  HttpContext::HttpContext(pHVar6,this->listenfd);
  bVar2 = Epoll::addFd((this->epoller)._M_t.
                       super___uniq_ptr_impl<sing::Epoll,_std::default_delete<sing::Epoll>_>._M_t.
                       super__Tuple_impl<0UL,_sing::Epoll_*,_std::default_delete<sing::Epoll>_>.
                       super__Head_base<0UL,_sing::Epoll_*,_false>._M_head_impl,this->listenfd,
                       pHVar6,0x80000001);
  if (!bVar2) {
    __assert_fail("epoller->addFd(listenfd, listenContext, (EPOLLIN | EPOLLET))==true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MisakiOfScut[P]SingHttpServer/src/Http/HttpServer.cpp"
                  ,0x23,"void sing::HttpServer::start()");
  }
  do {
    uVar3 = TimerManager::getNextTimeout
                      ((this->timerManager)._M_t.
                       super___uniq_ptr_impl<sing::TimerManager,_std::default_delete<sing::TimerManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_sing::TimerManager_*,_std::default_delete<sing::TimerManager>_>
                       .super__Head_base<0UL,_sing::TimerManager_*,_false>._M_head_impl);
    _Var4 = Epoll::wait((this->epoller)._M_t.
                        super___uniq_ptr_impl<sing::Epoll,_std::default_delete<sing::Epoll>_>._M_t.
                        super__Tuple_impl<0UL,_sing::Epoll_*,_std::default_delete<sing::Epoll>_>.
                        super__Head_base<0UL,_sing::Epoll_*,_false>._M_head_impl,
                        (void *)(ulong)uVar3);
    if (0 < _Var4) {
      index = 0;
      do {
        pHVar6 = Epoll::getDataPtr((this->epoller)._M_t.
                                   super___uniq_ptr_impl<sing::Epoll,_std::default_delete<sing::Epoll>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_sing::Epoll_*,_std::default_delete<sing::Epoll>_>
                                   .super__Head_base<0UL,_sing::Epoll_*,_false>._M_head_impl,index);
        uVar5 = Epoll::getEvents((this->epoller)._M_t.
                                 super___uniq_ptr_impl<sing::Epoll,_std::default_delete<sing::Epoll>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_sing::Epoll_*,_std::default_delete<sing::Epoll>_>
                                 .super__Head_base<0UL,_sing::Epoll_*,_false>._M_head_impl,index);
        if (pHVar6->fd == this->listenfd) {
          acceptConnection(this);
        }
        else if ((uVar5 & 0x2018) == 0) {
          if ((uVar5 & 1) == 0) {
            if ((uVar5 & 4) == 0) {
              syslog(0x20,"Epoll: Unexpected event");
              goto LAB_0010d9ca;
            }
            bVar2 = HttpRequest::keepAlive(&pHVar6->request);
            iVar7 = 300000;
            if (!bVar2) {
              iVar7 = this->timeout;
            }
            pTVar1 = (this->timerManager)._M_t.
                     super___uniq_ptr_impl<sing::TimerManager,_std::default_delete<sing::TimerManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sing::TimerManager_*,_std::default_delete<sing::TimerManager>_>
                     .super__Head_base<0UL,_sing::TimerManager_*,_false>._M_head_impl;
            local_48 = (HttpContext *)0x0;
            pHStack_40 = (HttpServer *)0x0;
            local_58._M_unused._M_object = (void *)0x0;
            local_58._8_8_ = 0;
            local_58._M_unused._M_object = operator_new(0x20);
            *(code **)local_58._M_unused._0_8_ = closeConnection;
            *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
            *(HttpContext **)((long)local_58._M_unused._0_8_ + 0x10) = pHVar6;
            *(HttpServer **)((long)local_58._M_unused._0_8_ + 0x18) = this;
            pHStack_40 = (HttpServer *)
                         std::
                         _Function_handler<void_(),_std::_Bind<void_(sing::HttpServer::*(sing::HttpServer_*,_sing::HttpContext_*))(sing::HttpContext_*)>_>
                         ::_M_invoke;
            local_48 = (HttpContext *)
                       std::
                       _Function_handler<void_(),_std::_Bind<void_(sing::HttpServer::*(sing::HttpServer_*,_sing::HttpContext_*))(sing::HttpContext_*)>_>
                       ::_M_manager;
            TimerManager::addTimer(pTVar1,pHVar6,iVar7,(function<void_()> *)&local_58);
            if (local_48 != (HttpContext *)0x0) {
              (*(code *)local_48)(&local_58,&local_58,3);
            }
            this_00 = (this->threadPool)._M_t.
                      super___uniq_ptr_impl<sing::ThreadPool,_std::default_delete<sing::ThreadPool>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_sing::ThreadPool_*,_std::default_delete<sing::ThreadPool>_>
                      .super__Head_base<0UL,_sing::ThreadPool_*,_false>._M_head_impl;
            local_58._M_unused._M_object = doResponse;
          }
          else {
            bVar2 = HttpRequest::keepAlive(&pHVar6->request);
            iVar7 = 300000;
            if (!bVar2) {
              iVar7 = this->timeout;
            }
            pTVar1 = (this->timerManager)._M_t.
                     super___uniq_ptr_impl<sing::TimerManager,_std::default_delete<sing::TimerManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_sing::TimerManager_*,_std::default_delete<sing::TimerManager>_>
                     .super__Head_base<0UL,_sing::TimerManager_*,_false>._M_head_impl;
            local_48 = (HttpContext *)0x0;
            pHStack_40 = (HttpServer *)0x0;
            local_58._M_unused._M_object = (void *)0x0;
            local_58._8_8_ = 0;
            local_58._M_unused._M_object = operator_new(0x20);
            *(code **)local_58._M_unused._0_8_ = closeConnection;
            *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
            *(HttpContext **)((long)local_58._M_unused._0_8_ + 0x10) = pHVar6;
            *(HttpServer **)((long)local_58._M_unused._0_8_ + 0x18) = this;
            pHStack_40 = (HttpServer *)
                         std::
                         _Function_handler<void_(),_std::_Bind<void_(sing::HttpServer::*(sing::HttpServer_*,_sing::HttpContext_*))(sing::HttpContext_*)>_>
                         ::_M_invoke;
            local_48 = (HttpContext *)
                       std::
                       _Function_handler<void_(),_std::_Bind<void_(sing::HttpServer::*(sing::HttpServer_*,_sing::HttpContext_*))(sing::HttpContext_*)>_>
                       ::_M_manager;
            TimerManager::addTimer(pTVar1,pHVar6,iVar7,(function<void_()> *)&local_58);
            if (local_48 != (HttpContext *)0x0) {
              (*(code *)local_48)(&local_58,&local_58,3);
            }
            this_00 = (this->threadPool)._M_t.
                      super___uniq_ptr_impl<sing::ThreadPool,_std::default_delete<sing::ThreadPool>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_sing::ThreadPool_*,_std::default_delete<sing::ThreadPool>_>
                      .super__Head_base<0UL,_sing::ThreadPool_*,_false>._M_head_impl;
            local_58._M_unused._M_object = doRequest;
          }
          local_58._8_8_ = 0;
          local_48 = pHVar6;
          pHStack_40 = this;
          ThreadPool::
          pushTask<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>>
                    (this_00,(_Bind<void_(sing::HttpServer::*(sing::HttpServer_*,_sing::HttpContext_*))(sing::HttpContext_*)>
                              *)&local_58);
        }
        else {
          closeConnection(this,pHVar6);
        }
LAB_0010d9ca:
        index = index + 1;
      } while (_Var4 != index);
    }
    TimerManager::tick((this->timerManager)._M_t.
                       super___uniq_ptr_impl<sing::TimerManager,_std::default_delete<sing::TimerManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_sing::TimerManager_*,_std::default_delete<sing::TimerManager>_>
                       .super__Head_base<0UL,_sing::TimerManager_*,_false>._M_head_impl);
  } while( true );
}

Assistant:

void HttpServer::start(){
    HttpContext *listenContext = new HttpContext(listenfd);
    assert(epoller->addFd(listenfd, listenContext, (EPOLLIN | EPOLLET))==true);

    int timeMs;
    while (1)
    {
        timeMs = timerManager->getNextTimeout();
        int ev_num = epoller->wait(timeMs);
        for (int i = 0; i < ev_num; ++i)
        {
            HttpContext* context = epoller->getDataPtr(i); //maybe NULL
            uint32_t events = epoller->getEvents(i);
            int fd = context->getFd();

            if(fd==listenfd){
                acceptConnection();
            }
            else if(events & (EPOLLRDHUP | EPOLLHUP | EPOLLERR)){
                closeConnection(context);
            }
            else if(events & EPOLLIN){
                int t = context->keepAlive() ? 5*60*1000 : timeout;
                timerManager->addTimer(context, t, std::bind(&HttpServer::closeConnection, this, context));
                threadPool->pushTask(std::bind(&HttpServer::doRequest, this, context));
            }
            else if(events & EPOLLOUT){
                int t = context->keepAlive() ? 5*60*1000 : timeout;
                timerManager->addTimer(context, t, std::bind(&HttpServer::closeConnection, this, context));
                threadPool->pushTask(std::bind(&HttpServer::doResponse, this, context));
            }
            else{
                syslog(LOG_PERROR, "Epoll: Unexpected event");
            }
        }
        timerManager->tick();
    }
}